

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp2.c
# Opt level: O3

void ssh2_bpp_free_outgoing_crypto(ssh2_bpp_state *s)

{
  ssh2_mac *psVar1;
  ssh_cipher *psVar2;
  ssh_compressor *psVar3;
  
  psVar1 = (s->out).mac;
  if (psVar1 != (ssh2_mac *)0x0) {
    (*psVar1->vt->free)(psVar1);
  }
  psVar2 = (s->out).cipher;
  if (psVar2 != (ssh_cipher *)0x0) {
    (*psVar2->vt->free)(psVar2);
  }
  psVar3 = s->out_comp;
  if (psVar3 != (ssh_compressor *)0x0) {
    (*psVar3->vt->compress_free)(psVar3);
    return;
  }
  return;
}

Assistant:

static void ssh2_bpp_free_outgoing_crypto(struct ssh2_bpp_state *s)
{
    /*
     * We must free the MAC before the cipher, because sometimes the
     * MAC is not actually separately allocated but just a different
     * facet of the same object as the cipher, in which case
     * ssh2_mac_free does nothing and ssh_cipher_free does the actual
     * freeing. So if we freed the cipher first and then tried to
     * dereference the MAC's vtable pointer to find out how to free
     * that too, we'd be accessing freed memory.
     */
    if (s->out.mac)
        ssh2_mac_free(s->out.mac);
    if (s->out.cipher)
        ssh_cipher_free(s->out.cipher);
    if (s->out_comp)
        ssh_compressor_free(s->out_comp);
}